

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voltage.h
# Opt level: O1

void saveVoltageTo(ostream *fs,int r,
                  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  *ivolt,vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                         *fvolt,
                  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  *fall)

{
  ulong uVar1;
  ostream *poVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong local_58;
  
  uVar1 = (ulong)(uint)r;
  *(uint *)(fs + *(long *)(*(long *)fs + -0x18) + 0x18) =
       *(uint *)(fs + *(long *)(*(long *)fs + -0x18) + 0x18) | 4;
  std::__ostream_insert<char,std::char_traits<char>>(fs,anon_var_dwarf_11a9ee,0x45);
  lVar3 = (long)(int)(r - 1U);
  uVar6 = (ulong)(r - 1U);
  if (0 < r) {
    local_58 = 0;
    do {
      if (r != 1) {
        uVar4 = 0;
        do {
          poVar2 = std::ostream::_M_insert<double>
                             ((double)*(float *)(*(long *)&(ivolt->
                                                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start
                                                  [local_58].
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data + uVar4 * 4));
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
          uVar4 = uVar4 + 1;
        } while (uVar6 != uVar4);
      }
      poVar2 = std::ostream::_M_insert<double>
                         ((double)*(float *)(*(long *)&(ivolt->
                                                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start
                                                  [local_58].
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data + lVar3 * 4));
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      local_58 = local_58 + 1;
    } while (local_58 != uVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(fs,anon_var_dwarf_11a9f9,0x61);
  if (0 < r) {
    uVar4 = 0;
    do {
      if (r != 1) {
        uVar5 = 0;
        do {
          poVar2 = std::ostream::_M_insert<double>
                             ((double)*(float *)(*(long *)&(fvolt->
                                                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[uVar4].
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data + uVar5 * 4));
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
          uVar5 = uVar5 + 1;
        } while (uVar6 != uVar5);
      }
      poVar2 = std::ostream::_M_insert<double>
                         ((double)*(float *)(*(long *)&(fvolt->
                                                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[uVar4].
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data + lVar3 * 4));
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (fs,"The potential drops on each resistance are saved in the potential drop matrix..\n",
             0x50);
  if (0 < r) {
    uVar4 = 0;
    do {
      if (r != 1) {
        uVar5 = 0;
        do {
          poVar2 = std::ostream::_M_insert<double>
                             ((double)*(float *)(*(long *)&(fall->
                                                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[uVar4].
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data + uVar5 * 4));
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
          uVar5 = uVar5 + 1;
        } while (uVar6 != uVar5);
      }
      poVar2 = std::ostream::_M_insert<double>
                         ((double)*(float *)(*(long *)&(fall->
                                                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[uVar4].
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data + lVar3 * 4));
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar1);
  }
  if (((byte)fs[*(long *)(*(long *)fs + -0x18) + 0x20] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nThere was an error in writing the file \'voltage.dat\'!\n",
               0x37);
    return;
  }
  puts("\nThe voltage.dat file was written correctly!");
  return;
}

Assistant:

inline void
saveVoltageTo(
        std::ostream &fs,
        int r,
        const vector<vector<float>> &ivolt,
        const vector<vector<float>> &fvolt,
        const vector<vector<float>> &fall
)
{
    fs.setf(std::ios::fixed);
    int i,j;

    /*Scrivo su file*/
    fs << "The values ​​obtained for the voltages respect the physical laws\n";
    for(i=0; i<=r-1; i++){
        for(j=0; j<r-1; j++) {
            fs << ivolt[i][j] << "\t";
        }
        fs << ivolt[i][r-1] << "\n";
    }
    fs << "The values ​​of the voltages at the end of the branch are saved in the final voltage matrix.\n";

    for(i=0; i<=r-1; i++){
        for(j=0; j<r-1; j++) {
            fs << fvolt[i][j] << "\t";
        }
        fs << fvolt[i][r-1] << "\n";
    }
    fs << "The potential drops on each resistance are saved in the potential drop matrix..\n";
    for(i=0; i<=r-1; i++){
        for(j=0; j<r-1; j++) {
            fs << fall[i][j] << "\t";
        }
        fs << fall[i][r-1] << "\n";
    }

    if (!fs)
        std::cout << "\nThere was an error in writing the file 'voltage.dat'!\n";
    else
        printf("\nThe voltage.dat file was written correctly!\n");
}